

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::fillcavity
          (tetgenmesh *this,arraypool *topshells,arraypool *botshells,arraypool *midfaces,
          arraypool *missingshs,arraypool *topnewtets,arraypool *botnewtets,triface *crossedge)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  unsigned_long uVar10;
  triface *ptVar11;
  point pdVar12;
  point pdVar13;
  double value;
  arraypool *local_1c8;
  arraypool *local_1a0;
  undefined1 local_190 [8];
  face neighsh;
  face casin;
  face casout;
  face newsh;
  face oldsh;
  int bflag;
  int interflag;
  int poss [4];
  int local_120 [2];
  int types [2];
  double ori;
  point pe;
  point pd;
  triface *midface;
  triface spintet_1;
  triface bottet;
  triface toptet;
  int j;
  int i;
  int t1ver;
  bool mflag;
  point pc;
  point pb;
  point pa;
  face checkseg;
  face *parysh;
  triface spintet;
  triface searchtet;
  triface *parytet;
  triface neightet;
  triface bdrytet;
  arraypool *cavshells;
  arraypool *topnewtets_local;
  arraypool *missingshs_local;
  arraypool *midfaces_local;
  arraypool *botshells_local;
  arraypool *topshells_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&parytet);
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&parysh);
  face::face((face *)&pa);
  for (toptet.ver = 0; toptet.ver < 2; toptet.ver = toptet.ver + 1) {
    local_1a0 = botshells;
    if (toptet.ver == 0) {
      local_1a0 = topshells;
    }
    if (local_1a0 != (arraypool *)0x0) {
      for (toptet._12_4_ = 0; (long)(int)toptet._12_4_ < local_1a0->objects;
          toptet._12_4_ = toptet._12_4_ + 1) {
        checkseg._8_8_ =
             local_1a0->toparray
             [(int)toptet._12_4_ >> ((byte)local_1a0->log2objectsperblock & 0x1f)] +
             (toptet._12_4_ & local_1a0->objectsperblockmark) * local_1a0->objectbytes;
        decode(this,(tetrahedron)**(undefined8 **)checkseg._8_8_,(triface *)&neightet.ver);
        pdVar7 = org(this,(triface *)&neightet.ver);
        pdVar8 = dest(this,(triface *)&neightet.ver);
        pdVar9 = apex(this,(triface *)&neightet.ver);
        stpivot(this,(face *)checkseg._8_8_,(triface *)&parytet);
        infect(this,(triface *)&parytet);
        bond(this,(triface *)&neightet.ver,(triface *)&parytet);
        tsdissolve(this,(triface *)&parytet);
        setpoint2tet(this,pdVar7,(tetrahedron)parytet);
        setpoint2tet(this,pdVar8,(tetrahedron)parytet);
        setpoint2tet(this,pdVar9,(tetrahedron)parytet);
      }
    }
  }
  if (crossedge == (triface *)0x0) {
    bVar1 = true;
  }
  else {
    triface::triface((triface *)&bottet.ver);
    triface::triface((triface *)&spintet_1.ver);
    triface::triface((triface *)&midface);
    bVar1 = false;
    pdVar7 = org(this,crossedge);
    pdVar8 = dest(this,crossedge);
    toptet._12_4_ = 0;
    while( true ) {
      bVar2 = 0;
      if ((long)(int)toptet._12_4_ < topnewtets->objects) {
        bVar2 = bVar1 ^ 1;
      }
      if (bVar2 == 0) break;
      triface::operator=((triface *)&spintet.ver,
                         (triface *)
                         (topnewtets->toparray
                          [(int)toptet._12_4_ >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                         (toptet._12_4_ & topnewtets->objectsperblockmark) * topnewtets->objectbytes
                         ));
      searchtet.tet._0_4_ = 0;
      while( true ) {
        bVar2 = 0;
        if ((int)searchtet.tet < 4) {
          bVar2 = bVar1 ^ 1;
        }
        if (bVar2 == 0) break;
        pb = org(this,(triface *)&spintet.ver);
        bVar5 = pmarktested(this,pb);
        if (bVar5) {
          pc = dest(this,(triface *)&spintet.ver);
          bVar5 = pmarktested(this,pc);
          if (bVar5) {
            pdVar9 = apex(this,(triface *)&spintet.ver);
            bVar5 = pmarktested(this,pdVar9);
            if ((bVar5) &&
               (iVar6 = tri_edge_test(this,pb,pc,pdVar9,pdVar7,pdVar8,(point)0x0,1,local_120,&bflag)
               , iVar6 == 2)) {
              triface::operator=((triface *)&bottet.ver,(triface *)&spintet.ver);
              types = (int  [2])orient3d(pb,pc,pdVar9,pdVar7);
              if (0.0 <= (double)types) {
                if (((double)types == 0.0) && (!NAN((double)types))) {
                  terminatetetgen(this,2);
                }
              }
              else {
                decode(this,*(tetrahedron *)(bottet._8_8_ + (long)(int)((uint)toptet.tet & 3) * 8),
                       (triface *)&bottet.ver);
                toptet.tet._0_4_ = fsymtbl[(int)(uint)toptet.tet][(int)(uint)toptet.tet];
                pb = org(this,(triface *)&bottet.ver);
                pc = dest(this,(triface *)&bottet.ver);
              }
              for (toptet.ver = 0; (long)toptet.ver < botnewtets->objects;
                  toptet.ver = toptet.ver + 1) {
                triface::operator=((triface *)&parytet,
                                   (triface *)
                                   (botnewtets->toparray
                                    [toptet.ver >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                                   (toptet.ver & botnewtets->objectsperblockmark) *
                                   botnewtets->objectbytes));
                if (parytet[2].tet == (tetrahedron *)pc) {
                  neightet.tet._0_4_ = 0xb;
LAB_00144105:
                  pdVar12 = dest(this,(triface *)&parytet);
                  if (pdVar12 != pb) {
                    pdVar12 = apex(this,(triface *)&parytet);
                    if (pdVar12 == pb) {
                      eprevesymself(this,(triface *)&parytet);
                    }
                    else {
                      pdVar12 = oppo(this,(triface *)&parytet);
                      if (pdVar12 != pb) goto LAB_001441c0;
                      esymself(this,(triface *)&parytet);
                      enextself(this,(triface *)&parytet);
                    }
                  }
                  pdVar12 = apex(this,(triface *)&parytet);
                  if (pdVar12 == pdVar9) {
                    triface::operator=((triface *)&spintet_1.ver,(triface *)&parytet);
                    bVar1 = true;
                    break;
                  }
                }
                else {
                  if (*(point *)&parytet[2].ver == pc) {
                    neightet.tet._0_4_ = 3;
                    goto LAB_00144105;
                  }
                  if (parytet[3].tet == (tetrahedron *)pc) {
                    neightet.tet._0_4_ = 7;
                    goto LAB_00144105;
                  }
                  if (*(point *)&parytet[3].ver == pc) {
                    neightet.tet._0_4_ = 0;
                    goto LAB_00144105;
                  }
                }
LAB_001441c0:
              }
            }
          }
        }
        searchtet.tet._0_4_ = (int)searchtet.tet + 1;
      }
      toptet._12_4_ = toptet._12_4_ + 1;
    }
    if (bVar1 == false) {
      bottet.ver = 0;
      bottet._12_4_ = 0;
      uVar10 = randomnation(this,(int)missingshs->objects - 1);
      face::operator=(&this->recentsh,
                      (face *)(missingshs->toparray
                               [(int)(uint)uVar10 >> ((byte)missingshs->log2objectsperblock & 0x1f)]
                              + (int)(((uint)uVar10 & missingshs->objectsperblockmark) *
                                     missingshs->objectbytes)));
    }
    else {
      bond(this,(triface *)&bottet.ver,(triface *)&spintet_1.ver);
      infect(this,(triface *)&bottet.ver);
      infect(this,(triface *)&spintet_1.ver);
      markface(this,(triface *)&bottet.ver);
      arraypool::newindex(midfaces,(void **)&searchtet.ver);
      triface::operator=((triface *)searchtet._8_8_,(triface *)&bottet.ver);
    }
    toptet._12_4_ = 0;
    while( true ) {
      bVar5 = false;
      if ((long)(int)toptet._12_4_ < midfaces->objects) {
        bVar5 = bVar1;
      }
      if (bVar5 == false) break;
      ptVar11 = (triface *)
                (midfaces->toparray
                 [(int)toptet._12_4_ >> ((byte)midfaces->log2objectsperblock & 0x1f)] +
                (toptet._12_4_ & midfaces->objectsperblockmark) * midfaces->objectbytes);
      toptet.ver = 0;
      while( true ) {
        bVar5 = false;
        if (toptet.ver < 3) {
          bVar5 = bVar1;
        }
        if (bVar5 == false) break;
        triface::operator=((triface *)&bottet.ver,ptVar11);
        bVar5 = false;
        do {
          esymself(this,(triface *)&bottet.ver);
          pdVar7 = apex(this,(triface *)&bottet.ver);
          bVar4 = pmarktested(this,pdVar7);
          if (bVar4) goto LAB_001444c1;
          if (pdVar7 == this->dummypoint) {
            terminatetetgen(this,2);
            goto LAB_001444c1;
          }
          decode(this,*(tetrahedron *)(bottet._8_8_ + (long)(int)((uint)toptet.tet & 3) * 8),
                 (triface *)&bottet.ver);
          toptet.tet._0_4_ = fsymtbl[(int)(uint)toptet.tet][(int)(uint)toptet.tet];
          bVar4 = marktested(this,(triface *)&bottet.ver);
        } while (bVar4);
        bVar5 = true;
LAB_001444c1:
        if ((!bVar5) && (bVar5 = facemarked(this,(triface *)&bottet.ver), !bVar5)) {
          fsym(this,ptVar11,(triface *)&spintet_1.ver);
          triface::operator=((triface *)&midface,(triface *)&spintet_1.ver);
          do {
            esymself(this,(triface *)&spintet_1.ver);
            pdVar8 = apex(this,(triface *)&spintet_1.ver);
            uVar3 = (uint)bottet.tet;
            if (pdVar8 == pdVar7) goto LAB_001445ce;
            decode(this,*(tetrahedron *)(spintet_1._8_8_ + (long)(int)((uint)bottet.tet & 3) * 8),
                   (triface *)&spintet_1.ver);
            bottet.tet._0_4_ = fsymtbl[(int)uVar3][(int)(uint)bottet.tet];
          } while ((triface *)spintet_1._8_8_ != midface);
          bVar1 = false;
LAB_001445ce:
          if (bVar1 == false) {
            fsym(this,ptVar11,(triface *)&spintet_1.ver);
            triface::operator=((triface *)&midface,(triface *)&spintet_1.ver);
            while( true ) {
              esymself(this,(triface *)&spintet_1.ver);
              pdVar8 = apex(this,(triface *)&spintet_1.ver);
              bVar5 = pmarktested(this,pdVar8);
              uVar3 = (uint)bottet.tet;
              if (bVar5) break;
              decode(this,*(tetrahedron *)(spintet_1._8_8_ + (long)(int)((uint)bottet.tet & 3) * 8),
                     (triface *)&spintet_1.ver);
              bottet.tet._0_4_ = fsymtbl[(int)uVar3][(int)(uint)bottet.tet];
            }
            pdVar9 = dest(this,(triface *)&bottet.ver);
            pdVar12 = oppo(this,(triface *)&bottet.ver);
            types = (int  [2])orient3d(pdVar9,pdVar7,pdVar12,pdVar8);
            if (0.0 <= (double)types) {
              if ((double)types <= 0.0) {
                terminatetetgen(this,2);
              }
              else {
                eprevself(this,(triface *)&bottet.ver);
                eprevself(this,(triface *)&spintet_1.ver);
              }
            }
            else {
              enextself(this,(triface *)&bottet.ver);
              enextself(this,(triface *)&spintet_1.ver);
            }
          }
          else {
            bVar5 = marktested(this,(triface *)&spintet_1.ver);
            if (bVar5) {
              bond(this,(triface *)&bottet.ver,(triface *)&spintet_1.ver);
              infect(this,(triface *)&bottet.ver);
              infect(this,(triface *)&spintet_1.ver);
              markface(this,(triface *)&bottet.ver);
              arraypool::newindex(midfaces,(void **)&searchtet.ver);
              triface::operator=((triface *)searchtet._8_8_,(triface *)&bottet.ver);
            }
            else {
              terminatetetgen(this,2);
            }
          }
        }
        enextself(this,ptVar11);
        toptet.ver = toptet.ver + 1;
      }
      toptet._12_4_ = toptet._12_4_ + 1;
    }
    if (bVar1 == false) {
      if (bottet._8_8_ != 0) {
        pdVar7 = org(this,(triface *)&bottet.ver);
        pdVar8 = dest(this,(triface *)&bottet.ver);
        pdVar9 = org(this,(triface *)&spintet_1.ver);
        pdVar12 = dest(this,(triface *)&spintet_1.ver);
        for (toptet._12_4_ = 1; (long)(int)toptet._12_4_ < missingshs->objects;
            toptet._12_4_ = toptet._12_4_ + 1) {
          checkseg._8_8_ =
               missingshs->toparray
               [(int)toptet._12_4_ >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
               (toptet._12_4_ & missingshs->objectsperblockmark) * missingshs->objectbytes;
          pdVar13 = sorg(this,(face *)checkseg._8_8_);
          if (((((pdVar13 == pdVar7) &&
                (pdVar13 = sdest(this,(face *)checkseg._8_8_), pdVar13 == pdVar8)) ||
               ((pdVar13 = sorg(this,(face *)checkseg._8_8_), pdVar13 == pdVar8 &&
                (pdVar13 = sdest(this,(face *)checkseg._8_8_), pdVar13 == pdVar7)))) ||
              ((pdVar13 = sorg(this,(face *)checkseg._8_8_), pdVar13 == pdVar9 &&
               (pdVar13 = sdest(this,(face *)checkseg._8_8_), pdVar13 == pdVar12)))) ||
             ((pdVar13 = sorg(this,(face *)checkseg._8_8_), pdVar13 == pdVar12 &&
              (pdVar13 = sdest(this,(face *)checkseg._8_8_), pdVar13 == pdVar9)))) break;
        }
        if ((long)(int)toptet._12_4_ < missingshs->objects) {
          face::operator=(&this->recentsh,(face *)checkseg._8_8_);
        }
        else {
          terminatetetgen(this,2);
        }
      }
    }
    else {
      if (2 < this->b->verbose) {
        printf("      Found %ld middle subfaces.\n",midfaces->objects);
      }
      face::face((face *)&newsh.shver);
      face::face((face *)&casout.shver);
      face::face((face *)&casin.shver);
      face::face((face *)&neighsh.shver);
      face::face((face *)local_190);
      face::operator=((face *)&newsh.shver,
                      (face *)missingshs->toparray
                              [0 >> ((byte)missingshs->log2objectsperblock & 0x1f)]);
      for (toptet._12_4_ = 0; (long)(int)toptet._12_4_ < midfaces->objects;
          toptet._12_4_ = toptet._12_4_ + 1) {
        ptVar11 = (triface *)
                  (midfaces->toparray
                   [(int)toptet._12_4_ >> ((byte)midfaces->log2objectsperblock & 0x1f)] +
                  (toptet._12_4_ & midfaces->objectsperblockmark) * midfaces->objectbytes);
        unmarkface(this,ptVar11);
        makeshellface(this,this->subfaces,(face *)&casout.shver);
        pdVar7 = org(this,ptVar11);
        setsorg(this,(face *)&casout.shver,pdVar7);
        pdVar7 = dest(this,ptVar11);
        setsdest(this,(face *)&casout.shver,pdVar7);
        pdVar7 = apex(this,ptVar11);
        setsapex(this,(face *)&casout.shver,pdVar7);
        iVar6 = shellmark(this,(face *)&newsh.shver);
        setshellmark(this,(face *)&casout.shver,iVar6);
        if (this->checkconstraints != 0) {
          value = areabound(this,(face *)&newsh.shver);
          setareabound(this,(face *)&casout.shver,value);
        }
        if (this->useinsertradius != 0) {
          iVar6 = getfacetindex(this,(face *)&newsh.shver);
          setfacetindex(this,(face *)&casout.shver,iVar6);
        }
        tsbond(this,ptVar11,(face *)&casout.shver);
        fsym(this,ptVar11,(triface *)&parytet);
        sesymself(this,(face *)&casout.shver);
        tsbond(this,(triface *)&parytet,(face *)&casout.shver);
      }
      for (toptet._12_4_ = 0; (long)(int)toptet._12_4_ < midfaces->objects;
          toptet._12_4_ = toptet._12_4_ + 1) {
        ptVar11 = (triface *)
                  (midfaces->toparray
                   [(int)toptet._12_4_ >> ((byte)midfaces->log2objectsperblock & 0x1f)] +
                  (toptet._12_4_ & midfaces->objectsperblockmark) * midfaces->objectbytes);
        for (toptet.ver = 0; toptet.ver < 3; toptet.ver = toptet.ver + 1) {
          tspivot(this,ptVar11,(face *)&casout.shver);
          spivot(this,(face *)&casout.shver,(face *)&casin.shver);
          if (casin._8_8_ == 0) {
            fnext(this,ptVar11,(triface *)&spintet.ver);
            while (tsspivot1(this,(triface *)&spintet.ver,(face *)&pa), pa == (point)0x0) {
              tspivot(this,(triface *)&spintet.ver,(face *)local_190);
              iVar6 = (int)searchtet.tet;
              if (local_190 != (undefined1  [8])0x0) {
                sbond(this,(face *)&casout.shver,(face *)local_190);
                goto LAB_00144f22;
              }
              decode(this,*(tetrahedron *)(spintet._8_8_ + (long)facepivot1[(int)searchtet.tet] * 8)
                     ,(triface *)&spintet.ver);
              searchtet.tet._0_4_ = facepivot2[iVar6][(int)searchtet.tet];
            }
            checkseg.sh._0_4_ = 0;
            spivot(this,(face *)&pa,(face *)&newsh.shver);
            bVar5 = sinfected(this,(face *)&pa);
            if (bVar5) {
              triface::operator=((triface *)&midface,(triface *)&spintet.ver);
              do {
                tssdissolve1(this,(triface *)&midface);
                iVar6 = (int)spintet_1.tet;
                decode(this,(tetrahedron)(&midface->tet)[facepivot1[(int)spintet_1.tet]],
                       (triface *)&midface);
                spintet_1.tet._0_4_ = facepivot2[iVar6][(int)spintet_1.tet];
              } while (midface != (triface *)spintet._8_8_);
              shellfacedealloc(this,this->subsegs,(shellface *)pa);
              ssdissolve(this,(face *)&newsh.shver);
              pa = (point)0x0;
            }
            spivot(this,(face *)&newsh.shver,(face *)&casin.shver);
            if (casin._8_8_ != 0) {
              face::operator=((face *)&neighsh.shver,(face *)&casin.shver);
              if (pa != (point)0x0) {
                checkseg.sh._0_4_ = 0;
                pdVar7 = sorg(this,(face *)&casout.shver);
                pdVar8 = sorg(this,(face *)&pa);
                if (pdVar7 != pdVar8) {
                  sesymself(this,(face *)&casout.shver);
                }
                spivot(this,(face *)&neighsh.shver,(face *)local_190);
                while (local_190 != (undefined1  [8])newsh._8_8_) {
                  face::operator=((face *)&neighsh.shver,(face *)local_190);
                  spivot(this,(face *)&neighsh.shver,(face *)local_190);
                }
              }
              sbond1(this,(face *)&casout.shver,(face *)&casin.shver);
              sbond1(this,(face *)&neighsh.shver,(face *)&casout.shver);
            }
            if (pa != (point)0x0) {
              ssbond(this,(face *)&casout.shver,(face *)&pa);
            }
          }
LAB_00144f22:
          enextself(this,ptVar11);
        }
      }
      for (toptet._12_4_ = 0; (long)(int)toptet._12_4_ < missingshs->objects;
          toptet._12_4_ = toptet._12_4_ + 1) {
        checkseg._8_8_ =
             missingshs->toparray
             [(int)toptet._12_4_ >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
             (toptet._12_4_ & missingshs->objectsperblockmark) * missingshs->objectbytes;
        shellfacedealloc(this,this->subfaces,*(shellface **)checkseg._8_8_);
      }
    }
    arraypool::restart(midfaces);
  }
  for (toptet.ver = 0; toptet.ver < 2; toptet.ver = toptet.ver + 1) {
    local_1c8 = botshells;
    if (toptet.ver == 0) {
      local_1c8 = topshells;
    }
    if (local_1c8 != (arraypool *)0x0) {
      for (toptet._12_4_ = 0; (long)(int)toptet._12_4_ < local_1c8->objects;
          toptet._12_4_ = toptet._12_4_ + 1) {
        checkseg._8_8_ =
             local_1c8->toparray
             [(int)toptet._12_4_ >> ((byte)local_1c8->log2objectsperblock & 0x1f)] +
             (toptet._12_4_ & local_1c8->objectsperblockmark) * local_1c8->objectbytes;
        shellfacedealloc(this,this->subfaces,*(shellface **)checkseg._8_8_);
      }
    }
  }
  arraypool::restart(topshells);
  if (botshells != (arraypool *)0x0) {
    arraypool::restart(botshells);
  }
  return bVar1;
}

Assistant:

bool tetgenmesh::fillcavity(arraypool* topshells, arraypool* botshells,
                            arraypool* midfaces, arraypool* missingshs,
                            arraypool* topnewtets, arraypool* botnewtets,
                            triface* crossedge)
{
  arraypool *cavshells;
  triface bdrytet, neightet, *parytet;
  triface searchtet, spintet;
  face *parysh;
  face checkseg;
  point pa, pb, pc;
  bool mflag;
  int t1ver;
  int i, j;

  // Connect newtets to tets outside the cavity.  These connections are needed
  //   for identifying the middle faces (which belong to R).
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        // Get a temp subface.
        parysh = (face *) fastlookup(cavshells, i);
        // Get the boundary tet outside the cavity (saved in sh[0]).
        decode(parysh->sh[0], bdrytet);
        pa = org(bdrytet);
        pb = dest(bdrytet);
        pc = apex(bdrytet);
        // Get the adjacent new tet inside the cavity.
        stpivot(*parysh, neightet);
        // Mark neightet as an interior tet of this cavity.
        infect(neightet);
        // Connect the two tets (the old connections are replaced).
        bond(bdrytet, neightet); 
        tsdissolve(neightet); // Clear the pointer to tmpsh.
        // Update the point-to-tets map.
        setpoint2tet(pa, (tetrahedron) neightet.tet);
        setpoint2tet(pb, (tetrahedron) neightet.tet);
        setpoint2tet(pc, (tetrahedron) neightet.tet);
      } // i
    } // if (cavshells != NULL)
  } // j

  if (crossedge != NULL) {
    // Glue top and bottom tets at their common facet.
    triface toptet, bottet, spintet, *midface;
    point pd, pe;
    REAL ori;
    int types[2], poss[4];
    int interflag;
    int bflag;

    mflag = false;
    pd = org(*crossedge);
    pe = dest(*crossedge);

    // Search the first (middle) face in R. 
    // Since R may be non-convex, we must make sure that the face is in the
    //   interior of R.  We search a face in 'topnewtets' whose three vertices
    //   are on R and it intersects 'crossedge' in its interior. Then search
    //   a matching face in 'botnewtets'.
    for (i = 0; i < topnewtets->objects && !mflag; i++) {
      searchtet = * (triface *) fastlookup(topnewtets, i);
      for (searchtet.ver = 0; searchtet.ver < 4 && !mflag; searchtet.ver++) {
        pa = org(searchtet);
        if (pmarktested(pa)) {
          pb = dest(searchtet);
          if (pmarktested(pb)) {
            pc = apex(searchtet);
            if (pmarktested(pc)) {
              // Check if this face intersects [d,e].
              interflag = tri_edge_test(pa,pb,pc,pd,pe,NULL,1,types,poss);
              if (interflag == 2) {
                // They intersect at a single point. Found.
                toptet = searchtet;
                // The face lies in the interior of R.
                // Get the tet (in topnewtets) which lies above R.
                ori = orient3d(pa, pb, pc, pd);
                if (ori < 0) {
                  fsymself(toptet);
                  pa = org(toptet);
                  pb = dest(toptet);
                } else if (ori == 0) {
                  terminatetetgen(this, 2);
                }
                // Search the face [b,a,c] in 'botnewtets'.
                for (j = 0; j < botnewtets->objects; j++) {
                  neightet = * (triface *) fastlookup(botnewtets, j);                  
                  // Is neightet contains 'b'.
                  if ((point) neightet.tet[4] == pb) {
                    neightet.ver = 11;
                  } else if ((point) neightet.tet[5] == pb) {
                    neightet.ver = 3;
                  } else if ((point) neightet.tet[6] == pb) {
                    neightet.ver = 7;
                  } else if ((point) neightet.tet[7] == pb) {
                    neightet.ver = 0;
                  } else {
                    continue;
                  }
                  // Is the 'neightet' contains edge [b,a].
                  if (dest(neightet) == pa) {
                    // 'neightet' is just the edge.
                  } else if (apex(neightet) == pa) {
                    eprevesymself(neightet);
                  } else if (oppo(neightet) == pa) {
                    esymself(neightet);
                    enextself(neightet);
                  } else {
                    continue;
                  }
                  // Is 'neightet' the face [b,a,c]. 
                  if (apex(neightet) == pc) {
                    bottet = neightet;
                    mflag = true;
                    break;
                  }
                } // j
              } // if (interflag == 2)
            } // pc
          } // pb
        } // pa
      } // toptet.ver
    } // i

    if (mflag) {
      // Found a pair of matched faces in 'toptet' and 'bottet'.
      bond(toptet, bottet);
      // Both are interior tets.
      infect(toptet);
      infect(bottet);
      // Add this face into search list.
      markface(toptet);
      midfaces->newindex((void **) &parytet);
      *parytet = toptet;
    } else {
      // No pair of 'toptet' and 'bottet'.
      toptet.tet = NULL;
      // Randomly split an interior edge of R.
      i = randomnation(missingshs->objects - 1);
      recentsh = * (face *) fastlookup(missingshs, i);
    }

    // Find other middle faces, connect top and bottom tets.
    for (i = 0; i < midfaces->objects && mflag; i++) {
      // Get a matched middle face [a, b, c]
      midface = (triface *) fastlookup(midfaces, i);
      // Check the neighbors at the edges of this face. 
      for (j = 0; j < 3 && mflag; j++) {
        toptet = *midface;
        bflag = false;
        while (1) {
          // Go to the next face in the same tet.
          esymself(toptet);
          pc = apex(toptet);
          if (pmarktested(pc)) {
            break; // Find a subface.
          }
          if (pc == dummypoint) {
            terminatetetgen(this, 2); // Check this case.
            break; // Find a subface.
          }
          // Go to the adjacent tet.
          fsymself(toptet);
          // Do we walk outside the cavity? 
          if (!marktested(toptet)) {
            // Yes, the adjacent face is not a middle face.
            bflag = true; break; 
          }
        }
        if (!bflag) {
          if (!facemarked(toptet)) {
            fsym(*midface, bottet);
            spintet = bottet;
            while (1) {
              esymself(bottet);
              pd = apex(bottet);
              if (pd == pc) break; // Face matched.
              fsymself(bottet);
              if (bottet.tet == spintet.tet) {
                // Not found a matched bottom face.
                mflag = false;
                break;
              }
            } // while (1)
            if (mflag) {
              if (marktested(bottet)) {
                // Connect two tets together.
                bond(toptet, bottet);
                // Both are interior tets.
                infect(toptet);
                infect(bottet);
                // Add this face into list.
                markface(toptet);
                midfaces->newindex((void **) &parytet);
                *parytet = toptet;
              }
              else {
                // The 'bottet' is not inside the cavity! 
                terminatetetgen(this, 2); // Check this case
              }
            } else { // mflag == false
              // Adjust 'toptet' and 'bottet' to be the crossing edges.
              fsym(*midface, bottet);
              spintet = bottet;
              while (1) {
                esymself(bottet);
                pd = apex(bottet);
                if (pmarktested(pd)) {
                  // assert(pd != pc);
                  // Let 'toptet' be [a,b,c,#], and 'bottet' be [b,a,d,*].
                  // Adjust 'toptet' and 'bottet' to be the crossing edges.
                  // Test orient3d(b,c,#,d).
                  ori = orient3d(dest(toptet), pc, oppo(toptet), pd);
                  if (ori < 0) {
                    // Edges [a,d] and [b,c] cross each other.
                    enextself(toptet); // [b,c]
                    enextself(bottet); // [a,d]
                  } else if (ori > 0) {
                    // Edges [a,c] and [b,d] cross each other. 
                    eprevself(toptet); // [c,a]
                    eprevself(bottet); // [d,b]
                  } else {
                    // b,c,#,and d are coplanar!.
                    terminatetetgen(this, 2); //assert(0);
                  }
                  break; // Not matched
                }
                fsymself(bottet);
              }
            } // if (!mflag)
          } // if (!facemarked(toptet))
        } // if (!bflag)
        enextself(*midface);
      } // j
    } // i

    if (mflag) {
      if (b->verbose > 2) {
        printf("      Found %ld middle subfaces.\n", midfaces->objects);
      }
      face oldsh, newsh, casout, casin, neighsh;

      oldsh = * (face *) fastlookup(missingshs, 0);

      // Create new subfaces to fill the region R.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        unmarkface(*midface);
        makeshellface(subfaces, &newsh);
        setsorg(newsh, org(*midface));
        setsdest(newsh, dest(*midface));
        setsapex(newsh, apex(*midface));
        // The new subface gets its markers from the old one.
        setshellmark(newsh, shellmark(oldsh));
        if (checkconstraints) {
          setareabound(newsh, areabound(oldsh));
        }
        if (useinsertradius) {
          setfacetindex(newsh, getfacetindex(oldsh));
        }
        // Connect the new subface to adjacent tets.
        tsbond(*midface, newsh);
        fsym(*midface, neightet);
        sesymself(newsh);
        tsbond(neightet, newsh);
      }

      // Connect new subfaces together and to the bdry of R.
      // Delete faked segments.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        for (j = 0; j < 3; j++) {
          tspivot(*midface, newsh);
          spivot(newsh, casout);
          if (casout.sh == NULL) {
            // Search its neighbor.
            fnext(*midface, searchtet);
            while (1) {
              // (1) First check if this side is a bdry edge of R.
              tsspivot1(searchtet, checkseg);
              if (checkseg.sh != NULL) {
                // It's a bdry edge of R.
                // Get the old subface.
                checkseg.shver = 0;
                spivot(checkseg, oldsh);
                if (sinfected(checkseg)) {
                  // It's a faked segment. Delete it.
                  spintet = searchtet;
                  while (1) {
                    tssdissolve1(spintet);
                    fnextself(spintet);
                    if (spintet.tet == searchtet.tet) break;
                  }
                  shellfacedealloc(subsegs, checkseg.sh);
                  ssdissolve(oldsh);
                  checkseg.sh = NULL;
                }
                spivot(oldsh, casout);
                if (casout.sh != NULL) {
                  casin = casout;
                  if (checkseg.sh != NULL) {
                    // Make sure that the subface has the right ori at the 
                    //   segment.
                    checkseg.shver = 0;
                    if (sorg(newsh) != sorg(checkseg)) {
                      sesymself(newsh);
                    }
                    spivot(casin, neighsh);
                    while (neighsh.sh != oldsh.sh) {
                      casin = neighsh;
                      spivot(casin, neighsh);
                    }
                  }
                  sbond1(newsh, casout);
                  sbond1(casin, newsh);
                }
                if (checkseg.sh != NULL) {
                  ssbond(newsh, checkseg);
                }
                break;
              } // if (checkseg.sh != NULL)
              // (2) Second check if this side is an interior edge of R.
              tspivot(searchtet, neighsh);
              if (neighsh.sh != NULL) {
                // Found an adjacent subface of newsh (an interior edge).
                sbond(newsh, neighsh);
                break;
              }
              fnextself(searchtet);
            } // while (1)
          } // if (casout.sh == NULL)
          enextself(*midface);
        } // j
      } // i

      // Delete old subfaces.
      for (i = 0; i < missingshs->objects; i++) {
        parysh = (face *) fastlookup(missingshs, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    } else {
      if (toptet.tet != NULL) {
        // Faces at top and bottom are not matched. 
        // Choose a Steiner point in R.
        // Split one of the crossing edges.
        pa = org(toptet);
        pb = dest(toptet);
        pc = org(bottet);
        pd = dest(bottet);
        // Search an edge in R which is either [a,b] or [c,d].
        // Reminder:  Subfaces in this list 'missingshs', except the first
        //   one, represents an interior edge of R. 
        for (i = 1; i < missingshs->objects; i++) {
          parysh = (face *) fastlookup(missingshs, i);
          if (((sorg(*parysh) == pa) && (sdest(*parysh) == pb)) ||
              ((sorg(*parysh) == pb) && (sdest(*parysh) == pa))) break;
          if (((sorg(*parysh) == pc) && (sdest(*parysh) == pd)) ||
              ((sorg(*parysh) == pd) && (sdest(*parysh) == pc))) break;
        }
        if (i < missingshs->objects) {
          // Found. Return it.
          recentsh = *parysh;
        } else {
          terminatetetgen(this, 2); //assert(0);
        }
      }
    }

    midfaces->restart();
  } else {
    mflag = true;
  } 

  // Delete the temp subfaces.
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    }
  }

  topshells->restart();
  if (botshells != NULL) {
    botshells->restart();
  }

  return mflag;
}